

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::slot_type<Vector3<double>,int>::
     construct<std::allocator<std::pair<Vector3<double>const,int>>>
               (allocator<std::pair<const_Vector3<double>,_int>_> *alloc,
               slot_type<Vector3<double>,_int> *slot,slot_type<Vector3<double>,_int> *other)

{
  slot_type<Vector3<double>,_int> *other_local;
  slot_type<Vector3<double>,_int> *slot_local;
  allocator<std::pair<const_Vector3<double>,_int>_> *alloc_local;
  
  slot_type<Vector3<double>,_int>::emplace(slot);
  allocator_traits<std::allocator<std::pair<Vector3<double>const,int>>>::
  construct<std::pair<Vector3<double>,int>,std::pair<Vector3<double>,int>>
            (alloc,(pair<Vector3<double>,_int> *)&slot->value,
             (pair<Vector3<double>,_int> *)&other->value);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, slot_type* other) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(
          *alloc, &slot->mutable_value, std::move(other->mutable_value));
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::move(other->value));
    }
  }